

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::OneHotEncoder::_InternalParse
          (OneHotEncoder *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  StringVector *msg;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *pAVar6;
  char cVar7;
  uint uVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  byte *local_30;
  
  local_30 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_30;
      uVar8 = (uint)bVar1;
      p = local_30 + 1;
      if ((char)bVar1 < '\0') {
        uVar8 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_30,uVar8);
          p = (byte *)pVar9.first;
          uVar8 = pVar9.second;
        }
        else {
          p = local_30 + 2;
        }
      }
      uVar3 = uVar8 >> 3;
      cVar7 = (char)uVar8;
      local_30 = p;
      if (uVar3 < 10) {
        if (uVar3 == 1) {
          if (cVar7 == '\n') {
            if (this->_oneof_case_[0] != 1) {
              clear_CategoryType(this);
              this->_oneof_case_[0] = 1;
              uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
              pAVar6 = (Arena *)(uVar5 & 0xfffffffffffffffc);
              if ((uVar5 & 1) != 0) {
                pAVar6 = *(Arena **)pAVar6;
              }
              msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                              (pAVar6);
              goto LAB_002b98a3;
            }
LAB_002b97ef:
            msg = (this->CategoryType_).stringcategories_;
            goto LAB_002b98af;
          }
LAB_002b983e:
          if ((uVar8 == 0) || ((uVar8 & 7) == 4)) {
            if (p == (byte *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar8 - 1;
            return (char *)p;
          }
          uVar5 = this_00->ptr_;
          if ((uVar5 & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((uVar5 & 0xfffffffffffffffc) + 8);
          }
          local_30 = (byte *)google::protobuf::internal::UnknownFieldParse
                                       (uVar8,unknown,(char *)local_30,ctx);
        }
        else {
          if ((uVar3 != 2) || (cVar7 != '\x12')) goto LAB_002b983e;
          if (this->_oneof_case_[0] == 2) goto LAB_002b97ef;
          clear_CategoryType(this);
          this->_oneof_case_[0] = 2;
          uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar6 = (Arena *)(uVar5 & 0xfffffffffffffffc);
          if ((uVar5 & 1) != 0) {
            pAVar6 = *(Arena **)pAVar6;
          }
          msg = (StringVector *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                          (pAVar6);
LAB_002b98a3:
          (this->CategoryType_).int64categories_ = (Int64Vector *)msg;
LAB_002b98af:
          local_30 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,&msg->super_MessageLite,(char *)local_30);
        }
LAB_002b98bf:
        if (local_30 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      else if (uVar3 == 10) {
        if (cVar7 != 'P') goto LAB_002b983e;
        uVar5 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar5 < 0) {
          uVar8 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_30 < '\0') {
            local_30 = p;
            pVar10 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar8);
            local_30 = (byte *)pVar10.first;
            this->outputsparse_ = pVar10.second != 0;
            goto LAB_002b98bf;
          }
          uVar5 = (ulong)uVar8;
          local_30 = p + 2;
        }
        this->outputsparse_ = uVar5 != 0;
      }
      else {
        if ((uVar3 != 0xb) || (cVar7 != 'X')) goto LAB_002b983e;
        uVar5 = (ulong)(char)*p;
        local_30 = p + 1;
        if ((long)uVar5 < 0) {
          uVar8 = ((uint)*local_30 * 0x80 + (uint)*p) - 0x80;
          if (-1 < (char)*local_30) {
            uVar5 = (ulong)uVar8;
            local_30 = p + 2;
            goto LAB_002b97d0;
          }
          local_30 = p;
          pVar10 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar8);
          iVar4 = (int)pVar10.second;
          local_30 = (byte *)pVar10.first;
          if (local_30 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_002b97d0:
          iVar4 = (int)uVar5;
        }
        this->handleunknown_ = iVar4;
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_30,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_30;
}

Assistant:

const char* OneHotEncoder::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.StringVector stringCategories = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringcategories(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector int64Categories = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64categories(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool outputSparse = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 80)) {
          outputsparse_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 88)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_handleunknown(static_cast<::CoreML::Specification::OneHotEncoder_HandleUnknown>(val));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}